

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_mul_exp(SyntaxAnalyze *this)

{
  int *piVar1;
  element_type *peVar2;
  bool bVar3;
  OperationType OVar4;
  ExpressNode *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Op op;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr SVar5;
  SharedExNdPtr father;
  SharedExNdPtr second;
  string tmpName;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  string local_50;
  
  *(undefined8 *)this = 0;
  this->matched_index = 0;
  gm_unary_exp((SyntaxAnalyze *)&tmpName);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&tmpName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmpName._M_string_length);
  while( true ) {
    bVar3 = try_word(in_RSI,1,MULT,DIV,MOD);
    if (!bVar3) break;
    second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (ExpressNode *)operator_new(0x48);
    express::ExpressNode::ExpressNode(this_00);
    std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<front::express::ExpressNode,void>
              ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&father,
               this_00);
    bVar3 = try_word(in_RSI,1,MULT);
    if (bVar3) {
      match_one_word(in_RSI,MULT);
      OVar4 = MUL;
      op = Mul;
    }
    else {
      bVar3 = try_word(in_RSI,1,DIV);
      if (bVar3) {
        match_one_word(in_RSI,DIV);
        OVar4 = DIV;
        op = Div;
      }
      else {
        match_one_word(in_RSI,MOD);
        OVar4 = MOD;
        op = Rem;
      }
    }
    (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _operation = OVar4;
    gm_unary_exp((SyntaxAnalyze *)&tmpName);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&tmpName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmpName._M_string_length);
    piVar1 = *(int **)this;
    if ((*piVar1 == 0) &&
       ((second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_type == CNS)) {
      (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = CNS;
      OVar4 = (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_operation;
      if (OVar4 == MUL) {
        (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_value = (second.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_value * piVar1[2];
      }
      else if (OVar4 == DIV) {
        (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_value = piVar1[2] /
                   (second.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_value;
      }
      else if (OVar4 == MOD) {
        (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_value = piVar1[2] %
                   (second.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->_value;
      }
    }
    else {
      tmpName._M_dataplus._M_p = (pointer)&tmpName.field_2;
      tmpName._M_string_length = 0;
      tmpName.field_2._M_local_buf[0] = '\0';
      irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_50,&in_RSI->irGenerator,Int);
      std::__cxx11::string::operator=((string *)&tmpName,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      (father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _type = VAR;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(father.
                   super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name);
      std::__cxx11::string::string((string *)&local_70,(string *)&tmpName);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,
                 (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 &second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                );
      hp_gn_binary_mir(in_RSI,&local_70,(SharedExNdPtr *)&local_80,(SharedExNdPtr *)&local_90,op);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&tmpName);
    }
    peVar2 = father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this);
    express::ExpressNode::addChild(peVar2,(SharedExNdPtr *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    peVar2 = father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,
               &second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(peVar2,(SharedExNdPtr *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               &father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&father.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&second.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar5.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_mul_exp() {
  SharedExNdPtr first;
  first = gm_unary_exp();

  while (try_word(1, Token::MULT, Token::DIV, Token::MOD)) {
    SharedExNdPtr second;
    SharedExNdPtr father(new ExpressNode());
    Op op;

    if (try_word(1, Token::MULT)) {
      match_one_word(Token::MULT);
      father->_operation = OperationType::MUL;
      op = Op::Mul;
    } else if (try_word(1, Token::DIV)) {
      match_one_word(Token::DIV);
      father->_operation = OperationType::DIV;
      op = Op::Div;
    } else {
      match_one_word(Token::MOD);
      father->_operation = OperationType::MOD;
      op = Op::Rem;
    }

    second = gm_unary_exp();

    if (first->_type == NodeType::CNS && second->_type == NodeType::CNS) {
      father->_type = NodeType::CNS;
      switch (father->_operation) {
        case OperationType::MUL:
          father->_value = first->_value * second->_value;
          break;
        case OperationType::DIV:
          father->_value = first->_value / second->_value;
          break;
        case OperationType::MOD:
          father->_value = first->_value % second->_value;
          break;
        default:
          break;
      }
    } else {
      string tmpName;

      tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
      father->_type = NodeType::VAR;
      father->_name = tmpName;

      hp_gn_binary_mir(tmpName, first, second, op);
    }
    father->addChild(first);
    father->addChild(second);
    first = father;
  }
  return first;
}